

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O0

void __thiscall Itemset::print_idlist(Itemset *this,ostream *idlstrm)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  ostream *poVar4;
  int local_24;
  int local_20;
  int cnt;
  int cid;
  int i;
  ostream *idlstrm_local;
  Itemset *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->theIval);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->theIval);
    iVar2 = Array::size(peVar3);
    if (0 < iVar2) {
      peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                         ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->theIval);
      local_20 = Array::operator[](peVar3,0);
      local_24 = 0;
      cnt = 0;
      while( true ) {
        peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            &this->theIval);
        iVar2 = Array::size(peVar3);
        if (iVar2 <= cnt) break;
        peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator*((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           &this->theIval);
        iVar2 = Array::operator[](peVar3,cnt);
        if (local_20 == iVar2) {
          local_24 = local_24 + 1;
          cnt = cnt + 2;
        }
        else {
          poVar4 = (ostream *)std::ostream::operator<<(idlstrm,local_20);
          poVar4 = std::operator<<(poVar4," ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_24);
          std::operator<<(poVar4," ");
          peVar3 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator*((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                             )&this->theIval);
          local_20 = Array::operator[](peVar3,cnt);
          local_24 = 0;
        }
      }
      poVar4 = (ostream *)std::ostream::operator<<(idlstrm,local_20);
      poVar4 = std::operator<<(poVar4," ");
      std::ostream::operator<<(poVar4,local_24);
    }
  }
  return;
}

Assistant:

void Itemset::print_idlist(ostream& idlstrm) {
    int i, cid, cnt;

    if (theIval && theIval->size() > 0) {
        cid = (*theIval)[0];
        cnt = 0;
        for (i = 0; i <theIval->size();) {
            if (cid == (*theIval)[i]) {
                cnt++;
                i += 2;
            } else {
                idlstrm << cid << " " << cnt << " ";
                cid = (*theIval)[i];
                cnt = 0;
            }
        }
        idlstrm << cid << " " << cnt;
    }
}